

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMemory.cpp
# Opt level: O0

int adios2::helper::NdCopy
              (char *in,CoreDims *inStart,CoreDims *inCount,bool inIsRowMajor,bool inIsLittleEndian,
              char *out,CoreDims *outStart,CoreDims *outCount,bool outIsRowMajor,
              bool outIsLittleEndian,int typeSize,CoreDims *inMemStart,CoreDims *inMemCount,
              CoreDims *outMemStart,CoreDims *outMemCount,bool safeMode,MemorySpace MemSpace,
              bool duringWrite)

{
  bool bVar1;
  CoreDims *pCVar2;
  anon_class_1_0_00000001 *paVar3;
  DimsArray *d1;
  CoreDims *ioStart;
  byte in_CL;
  CoreDims *in_RDX;
  CoreDims *in_RSI;
  undefined8 in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  CoreDims *in_stack_00000008;
  CoreDims *in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  CoreDims *in_stack_00000030;
  CoreDims *in_stack_00000038;
  CoreDims *in_stack_00000040;
  CoreDims *in_stack_00000048;
  byte in_stack_00000050;
  byte in_stack_00000060;
  DimsArray revOvlpStart_1;
  DimsArray revInCount;
  DimsArray revInStart;
  DimsArray revOvlpStart;
  DimsArray revOutCount;
  DimsArray revOutStart;
  anon_class_1_0_00000001 GetRltvOvlpStartPos;
  anon_class_1_0_00000001 GetBlockSize;
  anon_class_1_0_00000001 GetMinContDim;
  anon_class_1_0_00000001 GetIoOvlpGapSize;
  anon_class_1_0_00000001 GetOutOvlpBase;
  anon_class_1_0_00000001 GetInOvlpBase;
  anon_class_1_0_00000001 GetIoStrides;
  anon_class_1_0_00000001 HasOvlp;
  anon_class_1_0_00000001 GetOvlpCount;
  anon_class_1_0_00000001 GetOvlpEnd;
  anon_class_1_0_00000001 GetOvlpStart;
  anon_class_1_0_00000001 GetOutEnd;
  anon_class_1_0_00000001 GetInEnd;
  char *outOvlpBase;
  char *inOvlpBase;
  size_t blockSize;
  size_t minContDim;
  DimsArray outRltvOvlpStartPos;
  DimsArray inRltvOvlpStartPos;
  DimsArray outOvlpGapSize;
  DimsArray inOvlpGapSize;
  DimsArray outStride;
  DimsArray inStride;
  DimsArray ovlpCount;
  DimsArray ovlpEnd;
  DimsArray ovlpStart;
  DimsArray outEnd;
  DimsArray inEnd;
  DimsArray outMemCountNC;
  DimsArray outMemStartNC;
  DimsArray inMemCountNC;
  DimsArray inMemStartNC;
  CoreDims *in_stack_ffffffffffffe8c8;
  DimsArray *in_stack_ffffffffffffe8d0;
  DimsArray *in_stack_ffffffffffffe8d8;
  DimsArray *in_stack_ffffffffffffe8e0;
  CoreDims *in_stack_ffffffffffffe8e8;
  CoreDims *in_stack_ffffffffffffe8f0;
  CoreDims *in_stack_ffffffffffffe8f8;
  CoreDims *in_stack_ffffffffffffe900;
  CoreDims *in_stack_ffffffffffffe908;
  anon_class_1_0_00000001 *in_stack_ffffffffffffe910;
  CoreDims *inRltvOvlpSPos;
  CoreDims *outBase;
  char *in_stack_ffffffffffffe938;
  size_t *in_stack_ffffffffffffe940;
  size_t in_stack_ffffffffffffe948;
  CoreDims *in_stack_ffffffffffffe950;
  CoreDims *in_stack_ffffffffffffe958;
  size_t in_stack_ffffffffffffe960;
  size_t in_stack_ffffffffffffe9d8;
  CoreDims *in_stack_ffffffffffffe9e0;
  CoreDims *in_stack_ffffffffffffe9e8;
  CoreDims *in_stack_ffffffffffffe9f0;
  CoreDims *in_stack_ffffffffffffe9f8;
  CoreDims *in_stack_ffffffffffffea00;
  char **in_stack_ffffffffffffea08;
  char **in_stack_ffffffffffffea10;
  size_t in_stack_ffffffffffffea20;
  size_t in_stack_ffffffffffffea28;
  size_t in_stack_ffffffffffffea30;
  CoreDims *in_stack_ffffffffffffeaa8;
  CoreDims *in_stack_ffffffffffffeab0;
  CoreDims *in_stack_ffffffffffffeab8;
  CoreDims *in_stack_ffffffffffffeac0;
  char *in_stack_ffffffffffffeac8;
  char *in_stack_ffffffffffffead0;
  CoreDims *in_stack_ffffffffffffeae0;
  size_t in_stack_ffffffffffffeae8;
  CoreDims local_1398 [52];
  undefined8 local_1058;
  undefined8 local_1050;
  size_t local_1048;
  size_t local_1040;
  CoreDims local_bf8 [17];
  CoreDims local_ae8 [102];
  CoreDims local_488 [17];
  CoreDims local_378 [17];
  CoreDims local_268 [17];
  CoreDims local_158 [17];
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  undefined8 local_40;
  byte local_32;
  byte local_31;
  CoreDims *local_30;
  CoreDims *local_28;
  undefined8 local_20;
  
  local_31 = in_CL & 1;
  local_32 = in_R8B & 1;
  local_41 = in_stack_00000018 & 1;
  local_42 = in_stack_00000020 & 1;
  local_43 = in_stack_00000050 & 1;
  local_44 = in_stack_00000060 & 1;
  local_40 = in_R9;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  bVar1 = CoreDims::empty(in_stack_00000030);
  outBase = local_28;
  if (!bVar1) {
    outBase = in_stack_00000030;
  }
  DimsArray::DimsArray(in_stack_ffffffffffffe8e0,&in_stack_ffffffffffffe8d8->super_CoreDims);
  bVar1 = CoreDims::empty(in_stack_00000038);
  inRltvOvlpSPos = local_30;
  if (!bVar1) {
    inRltvOvlpSPos = in_stack_00000038;
  }
  DimsArray::DimsArray(in_stack_ffffffffffffe8e0,&in_stack_ffffffffffffe8d8->super_CoreDims);
  bVar1 = CoreDims::empty(in_stack_00000040);
  if (!bVar1) {
    in_stack_00000008 = in_stack_00000040;
  }
  DimsArray::DimsArray(in_stack_ffffffffffffe8e0,&in_stack_ffffffffffffe8d8->super_CoreDims);
  bVar1 = CoreDims::empty(in_stack_00000048);
  if (!bVar1) {
    in_stack_00000010 = in_stack_00000048;
  }
  DimsArray::DimsArray(in_stack_ffffffffffffe8e0,&in_stack_ffffffffffffe8d8->super_CoreDims);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  CoreDims::size(local_28);
  DimsArray::DimsArray(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
  local_1050 = 0;
  local_1058 = 0;
  if (((local_31 & 1) == 0) || ((local_41 & 1) == 0)) {
    if (((local_31 & 1) == 0) && ((local_41 & 1) == 0)) {
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      bVar1 = NdCopy::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8d8,
                         &in_stack_ffffffffffffe8d0->super_CoreDims,in_stack_ffffffffffffe8c8);
      if (!bVar1) {
        return 1;
      }
      NdCopy::anon_class_1_0_00000001::operator()
                (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,in_stack_ffffffffffffe900,
                 (size_t)in_stack_ffffffffffffe8f8);
      NdCopy::anon_class_1_0_00000001::operator()
                (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,in_stack_ffffffffffffe900,
                 (size_t)in_stack_ffffffffffffe8f8);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
    }
    else if (((local_31 & 1) == 0) || ((local_41 & 1) != 0)) {
      if (((local_31 & 1) == 0) && ((local_41 & 1) != 0)) {
        DimsArray::DimsArray(in_stack_ffffffffffffe8e0,&in_stack_ffffffffffffe8d8->super_CoreDims);
        DimsArray::DimsArray(in_stack_ffffffffffffe8e0,&in_stack_ffffffffffffe8d8->super_CoreDims);
        pCVar2 = (CoreDims *)CoreDims::begin(local_158);
        CoreDims::end(local_158);
        std::reverse<unsigned_long*>
                  ((unsigned_long *)in_stack_ffffffffffffe8d0,&in_stack_ffffffffffffe8c8->DimCount);
        paVar3 = (anon_class_1_0_00000001 *)CoreDims::begin(local_268);
        CoreDims::end(local_268);
        std::reverse<unsigned_long*>
                  ((unsigned_long *)in_stack_ffffffffffffe8d0,&in_stack_ffffffffffffe8c8->DimCount);
        NdCopy::anon_class_1_0_00000001::operator()
                  (paVar3,pCVar2,&in_stack_ffffffffffffe8e0->super_CoreDims,
                   &in_stack_ffffffffffffe8d8->super_CoreDims);
        NdCopy::anon_class_1_0_00000001::operator()
                  (paVar3,pCVar2,&in_stack_ffffffffffffe8e0->super_CoreDims,
                   &in_stack_ffffffffffffe8d8->super_CoreDims);
        NdCopy::anon_class_1_0_00000001::operator()
                  (paVar3,pCVar2,&in_stack_ffffffffffffe8e0->super_CoreDims,
                   &in_stack_ffffffffffffe8d8->super_CoreDims);
        NdCopy::anon_class_1_0_00000001::operator()
                  (paVar3,pCVar2,&in_stack_ffffffffffffe8e0->super_CoreDims,
                   &in_stack_ffffffffffffe8d8->super_CoreDims);
        NdCopy::anon_class_1_0_00000001::operator()
                  (paVar3,pCVar2,&in_stack_ffffffffffffe8e0->super_CoreDims,
                   &in_stack_ffffffffffffe8d8->super_CoreDims);
        bVar1 = NdCopy::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8d8,
                           &in_stack_ffffffffffffe8d0->super_CoreDims,in_stack_ffffffffffffe8c8);
        if (!bVar1) {
          return 1;
        }
        NdCopy::anon_class_1_0_00000001::operator()
                  (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,in_stack_ffffffffffffe900,
                   (size_t)in_stack_ffffffffffffe8f8);
        NdCopy::anon_class_1_0_00000001::operator()
                  (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,in_stack_ffffffffffffe900,
                   (size_t)in_stack_ffffffffffffe8f8);
        d1 = (DimsArray *)CoreDims::begin(local_ae8);
        CoreDims::end(local_ae8);
        std::reverse<unsigned_long*>
                  ((unsigned_long *)in_stack_ffffffffffffe8d0,&in_stack_ffffffffffffe8c8->DimCount);
        DimsArray::DimsArray(in_stack_ffffffffffffe8e0,d1);
        ioStart = (CoreDims *)CoreDims::begin((CoreDims *)&stack0xffffffffffffe938);
        CoreDims::end((CoreDims *)&stack0xffffffffffffe938);
        std::reverse<unsigned_long*>
                  ((unsigned_long *)in_stack_ffffffffffffe8d0,&in_stack_ffffffffffffe8c8->DimCount);
        NdCopy::anon_class_1_0_00000001::operator()(paVar3,pCVar2,ioStart,&d1->super_CoreDims);
        NdCopy::anon_class_1_0_00000001::operator()(paVar3,pCVar2,ioStart,&d1->super_CoreDims);
      }
    }
    else {
      DimsArray::DimsArray(in_stack_ffffffffffffe8e0,&in_stack_ffffffffffffe8d8->super_CoreDims);
      DimsArray::DimsArray(in_stack_ffffffffffffe8e0,&in_stack_ffffffffffffe8d8->super_CoreDims);
      pCVar2 = (CoreDims *)CoreDims::begin(local_378);
      CoreDims::end(local_378);
      std::reverse<unsigned_long*>
                ((unsigned_long *)in_stack_ffffffffffffe8d0,&in_stack_ffffffffffffe8c8->DimCount);
      paVar3 = (anon_class_1_0_00000001 *)CoreDims::begin(local_488);
      CoreDims::end(local_488);
      std::reverse<unsigned_long*>
                ((unsigned_long *)in_stack_ffffffffffffe8d0,&in_stack_ffffffffffffe8c8->DimCount);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      bVar1 = NdCopy::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8d8,
                         &in_stack_ffffffffffffe8d0->super_CoreDims,in_stack_ffffffffffffe8c8);
      if (!bVar1) {
        return 1;
      }
      NdCopy::anon_class_1_0_00000001::operator()
                (paVar3,pCVar2,in_stack_ffffffffffffe900,(size_t)in_stack_ffffffffffffe8f8);
      NdCopy::anon_class_1_0_00000001::operator()
                (paVar3,pCVar2,in_stack_ffffffffffffe900,(size_t)in_stack_ffffffffffffe8f8);
      CoreDims::begin(local_bf8);
      CoreDims::end(local_bf8);
      std::reverse<unsigned_long*>
                ((unsigned_long *)in_stack_ffffffffffffe8d0,&in_stack_ffffffffffffe8c8->DimCount);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
      DimsArray::DimsArray(in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8d8);
      CoreDims::begin(local_1398);
      CoreDims::end(local_1398);
      std::reverse<unsigned_long*>
                ((unsigned_long *)in_stack_ffffffffffffe8d0,&in_stack_ffffffffffffe8c8->DimCount);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                 &in_stack_ffffffffffffe8e0->super_CoreDims,
                 &in_stack_ffffffffffffe8d8->super_CoreDims);
    }
    local_1050 = local_20;
    local_1058 = local_40;
    if ((local_32 & 1) == (local_42 & 1)) {
      if ((local_43 & 1) == 0) {
        NdCopyRecurDFNonSeqDynamic
                  ((size_t)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938,(char *)outBase,
                   inRltvOvlpSPos,in_stack_00000008,in_stack_00000010,in_stack_ffffffffffffe950,
                   in_stack_ffffffffffffe958,in_stack_ffffffffffffe960);
      }
      else {
        NdCopyIterDFDynamic(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8,
                            in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8,
                            in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,
                            in_stack_ffffffffffffeae0,in_stack_ffffffffffffeae8);
      }
    }
    else if ((local_43 & 1) == 0) {
      NdCopyRecurDFNonSeqDynamicRevEndian
                ((size_t)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938,(char *)outBase,
                 inRltvOvlpSPos,in_stack_00000008,in_stack_00000010,in_stack_ffffffffffffe950,
                 in_stack_ffffffffffffe958,in_stack_ffffffffffffe960);
    }
    else {
      NdCopyIterDFDynamicRevEndian
                (in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8,in_stack_ffffffffffffeac0,
                 in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,
                 in_stack_ffffffffffffeae0,in_stack_ffffffffffffeae8);
    }
  }
  else {
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
               &in_stack_ffffffffffffe8e0->super_CoreDims,&in_stack_ffffffffffffe8d8->super_CoreDims
              );
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
               &in_stack_ffffffffffffe8e0->super_CoreDims,&in_stack_ffffffffffffe8d8->super_CoreDims
              );
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
               &in_stack_ffffffffffffe8e0->super_CoreDims,&in_stack_ffffffffffffe8d8->super_CoreDims
              );
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
               &in_stack_ffffffffffffe8e0->super_CoreDims,&in_stack_ffffffffffffe8d8->super_CoreDims
              );
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
               &in_stack_ffffffffffffe8e0->super_CoreDims,&in_stack_ffffffffffffe8d8->super_CoreDims
              );
    bVar1 = NdCopy::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8d8,
                       &in_stack_ffffffffffffe8d0->super_CoreDims,in_stack_ffffffffffffe8c8);
    if (!bVar1) {
      return 1;
    }
    NdCopy::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,in_stack_ffffffffffffe900,
               (size_t)in_stack_ffffffffffffe8f8);
    NdCopy::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,in_stack_ffffffffffffe900,
               (size_t)in_stack_ffffffffffffe8f8);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
               in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
               &in_stack_ffffffffffffe8e0->super_CoreDims);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
               in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
               &in_stack_ffffffffffffe8e0->super_CoreDims);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe900,
               (char **)in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
               in_stack_ffffffffffffe8e8,&in_stack_ffffffffffffe8e0->super_CoreDims,
               &in_stack_ffffffffffffe8d8->super_CoreDims);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe900,
               (char **)in_stack_ffffffffffffe8f8,(char *)in_stack_ffffffffffffe8f0,
               in_stack_ffffffffffffe8e8,&in_stack_ffffffffffffe8e0->super_CoreDims,
               &in_stack_ffffffffffffe8d8->super_CoreDims);
    local_1040 = NdCopy::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8e0,
                            &in_stack_ffffffffffffe8d8->super_CoreDims,
                            &in_stack_ffffffffffffe8d0->super_CoreDims,in_stack_ffffffffffffe8c8);
    local_1048 = NdCopy::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe8e0,
                            &in_stack_ffffffffffffe8d8->super_CoreDims,
                            (size_t)in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
    if ((local_32 & 1) == (local_42 & 1)) {
      if ((local_43 & 1) == 0) {
        NdCopyRecurDFSeqPadding
                  ((size_t)in_stack_ffffffffffffe910,(char **)in_stack_ffffffffffffe908,
                   (char **)in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
                   in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,&in_stack_00000008->DimCount,
                   &inRltvOvlpSPos->DimCount);
      }
      else {
        NdCopyIterDFSeqPadding
                  ((char **)in_stack_ffffffffffffea00,(char **)in_stack_ffffffffffffe9f8,
                   in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9e0,
                   in_stack_ffffffffffffe9d8,(size_t)in_stack_ffffffffffffea10);
      }
    }
    else if ((local_43 & 1) == 0) {
      NdCopyRecurDFSeqPaddingRevEndian
                ((size_t)in_stack_00000010,(char **)in_stack_ffffffffffffe910,
                 (char **)in_stack_ffffffffffffe908,in_stack_ffffffffffffe900,
                 in_stack_ffffffffffffe8f8,in_stack_ffffffffffffe8f0,(size_t)outBase,
                 (size_t)in_stack_ffffffffffffe938,(size_t)in_stack_ffffffffffffe940,
                 in_stack_ffffffffffffe948);
    }
    else {
      NdCopyIterDFSeqPaddingRevEndian
                (in_stack_ffffffffffffea10,in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
                 in_stack_ffffffffffffe9f8,in_stack_ffffffffffffe9f0,
                 (size_t)in_stack_ffffffffffffe9e8,in_stack_ffffffffffffea20,
                 in_stack_ffffffffffffea28,in_stack_ffffffffffffea30);
    }
  }
  return 0;
}

Assistant:

int NdCopy(const char *in, const CoreDims &inStart, const CoreDims &inCount,
           const bool inIsRowMajor, const bool inIsLittleEndian, char *out,
           const CoreDims &outStart, const CoreDims &outCount, const bool outIsRowMajor,
           const bool outIsLittleEndian, const int typeSize, const CoreDims &inMemStart,
           const CoreDims &inMemCount, const CoreDims &outMemStart, const CoreDims &outMemCount,
           const bool safeMode, const MemorySpace MemSpace, const bool duringWrite)

{

    // use values of ioStart and ioCount if ioMemStart and ioMemCount are
    // left as default
    DimsArray inMemStartNC = inMemStart.empty() ? inStart : inMemStart;
    DimsArray inMemCountNC = inMemCount.empty() ? inCount : inMemCount;
    DimsArray outMemStartNC = outMemStart.empty() ? outStart : outMemStart;
    DimsArray outMemCountNC = outMemCount.empty() ? outCount : outMemCount;

    DimsArray inEnd(inStart.size());
    DimsArray outEnd(inStart.size());
    DimsArray ovlpStart(inStart.size());
    DimsArray ovlpEnd(inStart.size());
    DimsArray ovlpCount(inStart.size());
    DimsArray inStride(inStart.size());
    DimsArray outStride(inStart.size());
    DimsArray inOvlpGapSize(inStart.size());
    DimsArray outOvlpGapSize(inStart.size());
    DimsArray inRltvOvlpStartPos(inStart.size());
    DimsArray outRltvOvlpStartPos(inStart.size());
    size_t minContDim, blockSize;
    const char *inOvlpBase = nullptr;
    char *outOvlpBase = nullptr;
    auto GetInEnd = [](CoreDims &inEnd, const CoreDims &inStart, const CoreDims &inCount) {
        for (size_t i = 0; i < inStart.size(); i++)
        {
            inEnd[i] = inStart[i] + inCount[i] - 1;
        }
    };
    auto GetOutEnd = [](CoreDims &outEnd, const CoreDims &outStart, const CoreDims &output_count) {
        for (size_t i = 0; i < outStart.size(); i++)
        {
            outEnd[i] = outStart[i] + output_count[i] - 1;
        }
    };
    auto GetOvlpStart = [](CoreDims &ovlpStart, const CoreDims &inStart, const CoreDims &outStart) {
        for (size_t i = 0; i < ovlpStart.size(); i++)
        {
            ovlpStart[i] = inStart[i] > outStart[i] ? inStart[i] : outStart[i];
        }
    };
    auto GetOvlpEnd = [](CoreDims &ovlpEnd, CoreDims &inEnd, CoreDims &outEnd) {
        for (size_t i = 0; i < ovlpEnd.size(); i++)
        {
            ovlpEnd[i] = inEnd[i] < outEnd[i] ? inEnd[i] : outEnd[i];
        }
    };
    auto GetOvlpCount = [](CoreDims &ovlpCount, CoreDims &ovlpStart, CoreDims &ovlpEnd) {
        for (size_t i = 0; i < ovlpCount.size(); i++)
        {
            ovlpCount[i] = ovlpEnd[i] - ovlpStart[i] + 1;
        }
    };
    auto HasOvlp = [](CoreDims &ovlpStart, CoreDims &ovlpEnd) {
        for (size_t i = 0; i < ovlpStart.size(); i++)
        {
            if (ovlpEnd[i] < ovlpStart[i])
            {
                return false;
            }
        }
        return true;
    };

    auto GetIoStrides = [](CoreDims &ioStride, const CoreDims &ioCount, size_t elmSize) {
        // ioStride[i] holds the total number of elements under each element
        // of the i'th dimension
        ioStride[ioStride.size() - 1] = elmSize;
        if (ioStride.size() > 1)
        {
            ioStride[ioStride.size() - 2] = ioCount[ioStride.size() - 1] * elmSize;
        }
        if (ioStride.size() > 2)
        {
            size_t i = ioStride.size() - 3;
            while (true)
            {
                ioStride[i] = ioCount[i + 1] * ioStride[i + 1];
                if (i == 0)
                {
                    break;
                }
                else
                {
                    i--;
                }
            }
        }
    };

    auto GetInOvlpBase = [](const char *&inOvlpBase, const char *in, const CoreDims &inStart,
                            CoreDims &inStride, CoreDims &ovlpStart) {
        inOvlpBase = in;
        for (size_t i = 0; i < inStart.size(); i++)
        {
            inOvlpBase = inOvlpBase + (ovlpStart[i] - inStart[i]) * inStride[i];
        }
    };
    auto GetOutOvlpBase = [](char *&outOvlpBase, char *out, const CoreDims &outStart,
                             CoreDims &outStride, CoreDims &ovlpStart) {
        outOvlpBase = out;
        for (size_t i = 0; i < outStart.size(); i++)
        {
            outOvlpBase = outOvlpBase + (ovlpStart[i] - outStart[i]) * outStride[i];
        }
    };
    auto GetIoOvlpGapSize = [](CoreDims &ioOvlpGapSize, CoreDims &ioStride, const CoreDims &ioCount,
                               CoreDims &ovlpCount) {
        for (size_t i = 0; i < ioOvlpGapSize.size(); i++)
        {
            ioOvlpGapSize[i] = (ioCount[i] - ovlpCount[i]) * ioStride[i];
        }
    };
    auto GetMinContDim = [](const CoreDims &inCount, const CoreDims &outCount,
                            CoreDims &ovlpCount) {
        //    note: minContDim is the first index where its input box and
        //    overlap box
        //    are not fully match. therefore all data below this branch is
        //    contingous
        //    and this determins the Biggest continuous block size - Each
        //    element of the
        //    current dimension.
        size_t i = ovlpCount.size() - 1;
        while (true)
        {
            if (i == 0)
            {
                break;
            }
            if ((inCount[i] != ovlpCount[i]) || (outCount[i] != ovlpCount[i]))
            {
                break;
            }
            i--;
        }
        return i;
    };
    auto GetBlockSize = [](CoreDims &ovlpCount, size_t minContDim, size_t elmSize) {
        size_t res = elmSize;
        for (size_t i = minContDim; i < ovlpCount.size(); i++)
        {
            res *= ovlpCount[i];
        }
        return res;
    };

    auto GetRltvOvlpStartPos = [](CoreDims &ioRltvOvlpStart, const CoreDims &ioStart,
                                  CoreDims &ovlpStart) {
        for (size_t i = 0; i < ioStart.size(); i++)
        {
            ioRltvOvlpStart[i] = ovlpStart[i] - ioStart[i];
        }
    };

    // main flow
    // row-major ==> row-major mode
    // algrithm optimizations:
    // 1. contigous data copying
    // 2. mem pointer arithmetics by sequential padding. O(1) overhead/block
    if (inIsRowMajor && outIsRowMajor)
    {
        GetInEnd(inEnd, inStart, inCount);
        GetOutEnd(outEnd, outStart, outCount);
        GetOvlpStart(ovlpStart, inStart, outStart);
        GetOvlpEnd(ovlpEnd, inEnd, outEnd);
        GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
        if (!HasOvlp(ovlpStart, ovlpEnd))
        {
            return 1; // no overlap found
        }
        GetIoStrides(inStride, inMemCountNC, typeSize);
        GetIoStrides(outStride, outMemCountNC, typeSize);
        GetIoOvlpGapSize(inOvlpGapSize, inStride, inMemCountNC, ovlpCount);
        GetIoOvlpGapSize(outOvlpGapSize, outStride, outMemCountNC, ovlpCount);
        GetInOvlpBase(inOvlpBase, in, inMemStartNC, inStride, ovlpStart);
        GetOutOvlpBase(outOvlpBase, out, outMemStartNC, outStride, ovlpStart);
        minContDim = GetMinContDim(inMemCountNC, outMemCountNC, ovlpCount);
        blockSize = GetBlockSize(ovlpCount, minContDim, typeSize);
        // same endianess mode: most optimized, contiguous data copying
        // algorithm used.
        if (inIsLittleEndian == outIsLittleEndian)
        {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
            if (MemSpace == MemorySpace::GPU)
            {
                helper::NdCopyGPU(inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize, ovlpCount,
                                  minContDim, blockSize, MemSpace, duringWrite);
                return 0;
            }
#endif
            // most efficient algm
            // warning: number of function stacks used is number of dimensions
            // of data.
            if (!safeMode)
            {
                NdCopyRecurDFSeqPadding(0, inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize,
                                        ovlpCount, minContDim, blockSize);
            }
            else // safeMode
            {
                //      //alternative iterative version, 10% slower then
                //      recursive
                //      //use it when very high demension is used.
                NdCopyIterDFSeqPadding(inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize,
                                       ovlpCount, minContDim, blockSize);
            }
        }
        // different endianess mode
        else
        {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
            if (MemSpace == MemorySpace::GPU)
            {
                helper::Throw<std::invalid_argument>(
                    "Helper", "Memory", "CopyContiguousMemory",
                    "Direct byte order reversal not supported for GPU buffers");
            }
#endif
            if (!safeMode)
            {
                NdCopyRecurDFSeqPaddingRevEndian(0, inOvlpBase, outOvlpBase, inOvlpGapSize,
                                                 outOvlpGapSize, ovlpCount, minContDim, blockSize,
                                                 typeSize, blockSize / typeSize);
            }
            else
            {
                NdCopyIterDFSeqPaddingRevEndian(inOvlpBase, outOvlpBase, inOvlpGapSize,
                                                outOvlpGapSize, ovlpCount, minContDim, blockSize,
                                                typeSize, blockSize / typeSize);
            }
        }
    }

    // Copying modes involing col-major
    // algorithm optimization:
    // 1. mem ptr arithmetics: O(1) overhead per block, dynamic/non-sequential
    // padding
    else
    {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
        if (MemSpace == MemorySpace::GPU)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "Memory", "CopyContiguousMemory",
                "Direct byte order reversal not supported for GPU buffers");
        }
#endif
        //        CoreDims revInCount(inCount);
        //        CoreDims revOutCount(outCount);
        //
        // col-major ==> col-major mode
        if (!inIsRowMajor && !outIsRowMajor)
        {

            GetInEnd(inEnd, inStart, inCount);
            GetOutEnd(outEnd, outStart, outCount);
            GetOvlpStart(ovlpStart, inStart, outStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            GetIoStrides(inStride, inCount, typeSize);
            GetIoStrides(outStride, outCount, typeSize);

            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, ovlpStart);
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, ovlpStart);
        }
        // row-major ==> col-major mode
        else if (inIsRowMajor && !outIsRowMajor)
        {
            DimsArray revOutStart(outStart);
            DimsArray revOutCount(outCount);

            std::reverse(outMemStartNC.begin(), outMemStartNC.end());
            std::reverse(outMemCountNC.begin(), outMemCountNC.end());

            GetInEnd(inEnd, inStart, inCount);
            GetOutEnd(outEnd, revOutStart, revOutCount);
            GetOvlpStart(ovlpStart, inStart, revOutStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            // get normal order inStride
            GetIoStrides(inStride, inMemCountNC, typeSize);

            // calulate reversed order outStride
            GetIoStrides(outStride, outMemCountNC, typeSize);
            // reverse outStride so that outStride aligns to inStride
            std::reverse(outStride.begin(), outStride.end());

            // get normal order inOvlpStart
            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, ovlpStart);

            // get reversed order outOvlpStart
            DimsArray revOvlpStart(ovlpStart);
            std::reverse(revOvlpStart.begin(), revOvlpStart.end());
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, revOvlpStart);
        }
        // col-major ==> row-major mode
        else if (!inIsRowMajor && outIsRowMajor)
        {
            DimsArray revInStart(inStart);
            DimsArray revInCount(inCount);
            std::reverse(inMemStartNC.begin(), inMemStartNC.end());
            std::reverse(inMemCountNC.begin(), inMemCountNC.end());

            GetInEnd(inEnd, revInStart, revInCount);
            GetOutEnd(outEnd, outStart, outCount);
            GetOvlpStart(ovlpStart, revInStart, outStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            // get normal order outStride
            GetIoStrides(outStride, outMemCountNC, typeSize);

            // calculate reversed inStride
            GetIoStrides(inStride, inMemCountNC, typeSize);
            // reverse inStride so that inStride aligns to outStride
            std::reverse(inStride.begin(), inStride.end());

            // get reversed order inOvlpStart
            DimsArray revOvlpStart(ovlpStart);
            std::reverse(revOvlpStart.begin(), revOvlpStart.end());
            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, revOvlpStart);
            // get normal order outOvlpStart
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, ovlpStart);
        }

        inOvlpBase = in;
        outOvlpBase = out;
        // Same Endian"
        if (inIsLittleEndian == outIsLittleEndian)
        {
            if (!safeMode)
            {
                NdCopyRecurDFNonSeqDynamic(0, inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                           outRltvOvlpStartPos, inStride, outStride, ovlpCount,
                                           typeSize);
            }
            else
            {
                NdCopyIterDFDynamic(inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                    outRltvOvlpStartPos, inStride, outStride, ovlpCount, typeSize);
            }
        }
        // different Endian"
        else
        {
            if (!safeMode)
            {
                NdCopyRecurDFNonSeqDynamicRevEndian(0, inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                                    outRltvOvlpStartPos, inStride, outStride,
                                                    ovlpCount, typeSize);
            }
            else
            {
                NdCopyIterDFDynamicRevEndian(inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                             outRltvOvlpStartPos, inStride, outStride, ovlpCount,
                                             typeSize);
            }
        }
    }
    return 0;
}